

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O1

bool __thiscall
QNativeSocketEnginePrivate::nativeBind
          (QNativeSocketEnginePrivate *this,QHostAddress *address,quint16 port)

{
  NetworkLayerProtocol NVar1;
  int iVar2;
  quint32 qVar3;
  int *piVar4;
  ErrorString errorString;
  byte bVar5;
  SocketError error;
  long in_FS_OFFSET;
  int ipv6only;
  socklen_t sockAddrSize;
  undefined4 local_60;
  socklen_t local_5c;
  qt_sockaddr local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  local_5c = 0xaaaaaaaa;
  setPortAndAddress(this,port,address,&local_58,&local_5c);
  if (local_58.a.sa_family == 10) {
    local_60 = 0;
    NVar1 = QHostAddress::protocol(address);
    if (NVar1 == IPv6Protocol) {
      local_60 = 1;
    }
    setsockopt((int)this->socketDescriptor,0x29,0x1a,&local_60,4);
  }
  iVar2 = bind((int)this->socketDescriptor,(sockaddr *)&local_58.a,local_5c);
  if (iVar2 < 0) {
    piVar4 = __errno_location();
    bVar5 = 1;
    if (*piVar4 == 0x61) {
      NVar1 = QHostAddress::protocol(address);
      if (NVar1 == AnyIPProtocol) {
        local_58.a4.sin_port = port << 8 | port >> 8;
        local_58.a.sa_family = 2;
        qVar3 = QHostAddress::toIPv4Address(address,(bool *)0x0);
        local_58.a6.sin6_flowinfo =
             qVar3 >> 0x18 | (qVar3 & 0xff0000) >> 8 | (qVar3 & 0xff00) << 8 | qVar3 << 0x18;
        local_5c = 0x10;
        iVar2 = bind((int)this->socketDescriptor,(sockaddr *)&local_58.a,0x10);
        bVar5 = (byte)((uint)iVar2 >> 0x1f);
      }
    }
  }
  else {
    bVar5 = 0;
  }
  if (bVar5 == 0) {
    (this->super_QAbstractSocketEnginePrivate).socketState = BoundState;
  }
  else {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    if (iVar2 < 0x62) {
      if (iVar2 == 0xd) {
        error = SocketAccessError;
        errorString = AddressProtectedErrorString;
      }
      else {
        if (iVar2 != 0x16) goto LAB_0023304c;
        error = UnsupportedSocketOperationError;
        errorString = OperationUnsupportedErrorString;
      }
    }
    else if (iVar2 == 99) {
      error = SocketAddressNotAvailableError;
      errorString = AddressNotAvailableErrorString;
    }
    else {
      if (iVar2 != 0x62) goto LAB_0023304c;
      error = AddressInUseError;
      errorString = AddressInuseErrorString;
    }
    setError(this,error,errorString);
  }
LAB_0023304c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)(bVar5 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEnginePrivate::nativeBind(const QHostAddress &address, quint16 port)
{
    qt_sockaddr aa;
    QT_SOCKLEN_T sockAddrSize;
    setPortAndAddress(port, address, &aa, &sockAddrSize);

#ifdef IPV6_V6ONLY
    if (aa.a.sa_family == AF_INET6) {
        int ipv6only = 0;
        if (address.protocol() == QAbstractSocket::IPv6Protocol)
            ipv6only = 1;
        //default value of this socket option varies depending on unix variant (or system configuration on BSD), so always set it explicitly
        ::setsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_V6ONLY, (char*)&ipv6only, sizeof(ipv6only) );
    }
#endif

    int bindResult = QT_SOCKET_BIND(socketDescriptor, &aa.a, sockAddrSize);
    if (bindResult < 0 && errno == EAFNOSUPPORT && address.protocol() == QAbstractSocket::AnyIPProtocol) {
        // retry with v4
        aa.a4.sin_family = AF_INET;
        aa.a4.sin_port = htons(port);
        aa.a4.sin_addr.s_addr = htonl(address.toIPv4Address());
        sockAddrSize = sizeof(aa.a4);
        bindResult = QT_SOCKET_BIND(socketDescriptor, &aa.a, sockAddrSize);
    }

    if (bindResult < 0) {
#if defined (QNATIVESOCKETENGINE_DEBUG)
        int ecopy = errno;
#endif
        switch(errno) {
        case EADDRINUSE:
            setError(QAbstractSocket::AddressInUseError, AddressInuseErrorString);
            break;
        case EACCES:
            setError(QAbstractSocket::SocketAccessError, AddressProtectedErrorString);
            break;
        case EINVAL:
            setError(QAbstractSocket::UnsupportedSocketOperationError, OperationUnsupportedErrorString);
            break;
        case EADDRNOTAVAIL:
            setError(QAbstractSocket::SocketAddressNotAvailableError, AddressNotAvailableErrorString);
            break;
        default:
            break;
        }

#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug("QNativeSocketEnginePrivate::nativeBind(%s, %i) == false (%s)",
               address.toString().toLatin1().constData(), port, strerror(ecopy));
#endif

        return false;
    }

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::nativeBind(%s, %i) == true",
           address.toString().toLatin1().constData(), port);
#endif
    socketState = QAbstractSocket::BoundState;
    return true;
}